

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O1

Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> * __thiscall
Inferences::intersectSortedStack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>>
          (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>
           *__return_storage_ptr__,Inferences *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *l,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *r)

{
  undefined8 *puVar1;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>
  *pPVar2;
  MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar3;
  bool bVar4;
  int iVar5;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar6;
  ulong uVar7;
  uint uVar8;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *pSVar9;
  long lVar10;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar11;
  ulong uVar12;
  long lVar13;
  uint local_54;
  
  pMVar6 = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(this + 8);
  pMVar11 = *(Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> **)(this + 0x10);
  uVar7 = (long)pMVar11 - (long)pMVar6;
  pSVar9 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this;
  if (pMVar11 != pMVar6) {
    pMVar6 = l->_stack;
    pMVar11 = l->_cursor;
    pSVar9 = l;
    if (pMVar11 != pMVar6) {
      pSVar9 = (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *)this;
      if ((ulong)((long)pMVar11 - (long)pMVar6) < uVar7) {
        pSVar9 = l;
      }
      lVar10 = *(long *)(this + 8);
      uVar7 = 0;
      if (*(long *)(this + 0x10) != lVar10) {
        uVar12 = 0;
        uVar8 = 0;
        local_54 = 0;
        do {
          pMVar11 = l->_stack;
          if ((ulong)((long)l->_cursor - (long)pMVar11 >> 5) <= uVar7) break;
          lVar13 = uVar12 * 0x20;
          if ((*(uint *)(lVar10 + 0x10 + lVar13) == pMVar11[uVar7].factors._id) &&
             (iVar5 = mpz_cmp((__mpz_struct *)(lVar10 + lVar13),(__mpz_struct *)(pMVar11 + uVar7)),
             iVar5 == 0)) {
            lVar10 = *(long *)(this + 8);
            uVar12 = (ulong)local_54;
            local_54 = local_54 + 1;
            pMVar11 = pSVar9->_stack;
            mpz_set((__mpz_struct *)(pMVar11 + uVar12),(__mpz_struct *)(lVar10 + lVar13));
            puVar1 = (undefined8 *)(lVar10 + 0x10 + lVar13);
            pMVar3 = (MonomFactors<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)puVar1[1];
            pPVar2 = &pMVar11[uVar12].factors;
            *(undefined8 *)pPVar2 = *puVar1;
            pPVar2->_ptr = pMVar3;
            uVar8 = uVar8 + 1;
LAB_004a069b:
            uVar7 = (ulong)((int)uVar7 + 1);
          }
          else {
            bVar4 = Kernel::operator<((Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
                                      (lVar13 + *(long *)(this + 8)),l->_stack + uVar7);
            if (!bVar4) goto LAB_004a069b;
            uVar8 = uVar8 + 1;
          }
          uVar12 = (ulong)uVar8;
          lVar10 = *(long *)(this + 8);
        } while (uVar12 < (ulong)(*(long *)(this + 0x10) - lVar10 >> 5));
        uVar7 = (ulong)local_54;
      }
      for (pMVar11 = pSVar9->_stack + uVar7; pMVar11 != pSVar9->_cursor; pMVar11 = pMVar11 + 1) {
        mpz_clear((__mpz_struct *)pMVar11);
      }
      pMVar6 = pSVar9->_stack;
      pMVar11 = pMVar6 + uVar7;
      pSVar9->_cursor = pMVar11;
    }
  }
  __return_storage_ptr__->_cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  __return_storage_ptr__->_end = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  __return_storage_ptr__->_capacity = 0;
  __return_storage_ptr__->_stack = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  __return_storage_ptr__->_capacity = pSVar9->_capacity;
  pSVar9->_capacity = 0;
  __return_storage_ptr__->_cursor = pMVar11;
  pSVar9->_cursor = (Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0;
  pMVar11 = __return_storage_ptr__->_end;
  __return_storage_ptr__->_end = pSVar9->_end;
  pSVar9->_end = pMVar11;
  pMVar11 = __return_storage_ptr__->_stack;
  __return_storage_ptr__->_stack = pMVar6;
  pSVar9->_stack = pMVar11;
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}